

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateQueryUtil.hpp
# Opt level: O3

bool __thiscall
deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[4]>::verifyValidity
          (StateQueryMemoryWriteGuard<float[4]> *this,ResultCollector *result)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  string local_30;
  
  if (*(char *)this->m_preguard == -0x22) {
    uVar2 = 0xffffffffffffffff;
    do {
      if (uVar2 == 0xe) goto LAB_00913eca;
      uVar3 = uVar2 + 1;
      lVar1 = uVar2 + 2;
      uVar2 = uVar3;
    } while (*(char *)((long)this->m_preguard + lVar1) == -0x22);
    if (0xe < uVar3) {
LAB_00913eca:
      if (*(char *)this->m_postguard == -0x22) {
        uVar2 = 0;
        do {
          uVar3 = uVar2;
          if (uVar3 == 0xf) goto LAB_00913f3e;
          uVar2 = uVar3 + 1;
        } while (*(char *)((long)this->m_postguard + uVar3 + 1) == -0x22);
        if (0xe < uVar3) {
LAB_00913f3e:
          if (*(char *)this->m_value != -0x22) {
            return true;
          }
          uVar2 = 0;
          do {
            uVar3 = uVar2;
            if (uVar3 == 0xf) goto LAB_00913f65;
            uVar2 = uVar3 + 1;
          } while (*(char *)((long)this->m_value + uVar3 + 1) == -0x22);
          if (uVar3 < 0xf) {
            return true;
          }
LAB_00913f65:
          local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_30,"Get* did not return a value","");
          tcu::ResultCollector::fail(result,&local_30);
          goto LAB_00913f1d;
        }
      }
      local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_30,"post-guard value was modified","");
      tcu::ResultCollector::fail(result,&local_30);
      goto LAB_00913f1d;
    }
  }
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_30,"pre-guard value was modified","");
  tcu::ResultCollector::fail(result,&local_30);
LAB_00913f1d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return false;
}

Assistant:

bool StateQueryMemoryWriteGuard<T>::verifyValidity (tcu::ResultCollector& result) const
{
	using tcu::TestLog;

	if (isPreguardContaminated())
	{
		result.fail("pre-guard value was modified");
		return false;
	}
	else if (isPostguardContaminated())
	{
		result.fail("post-guard value was modified");
		return false;
	}
	else if (isUndefined())
	{
		result.fail("Get* did not return a value");
		return false;
	}

	return true;
}